

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<float,float,float>
               (ImGuiDataType data_type,float *v,float v_speed,float v_min,float v_max,char *format,
               ImGuiSliderFlags flags)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  uint uVar6;
  ImGuiInputSource IVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar20 [64];
  float fVar21;
  float local_80;
  float local_68;
  undefined1 local_58 [16];
  undefined8 local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [56];
  
  pIVar4 = GImGui;
  auVar20._4_60_ = in_register_00001244;
  auVar20._0_4_ = v_min;
  uVar9 = flags & 0x100000;
  if ((((v_speed == 0.0) && (!NAN(v_speed))) && (v_min < v_max)) && (v_max - v_min < 3.4028235e+38))
  {
    v_speed = (v_max - v_min) * GImGui->DragSpeedDefaultRatio;
    in_XMM0_Db = 0;
    in_XMM0_Dc = 0;
    in_XMM0_Dd = 0;
  }
  uVar6 = data_type & 0xfffffffe;
  local_58._4_4_ = in_XMM0_Db;
  local_58._0_4_ = v_speed;
  local_58._8_4_ = in_XMM0_Dc;
  local_58._12_4_ = in_XMM0_Dd;
  IVar7 = GImGui->ActiveIdSource;
  if (IVar7 == ImGuiInputSource_Mouse) {
    bVar5 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar5) ||
       (bVar5 = IsMouseDragPastThreshold(0,(pIVar4->IO).MouseDragThreshold * 0.5), !bVar5)) {
      IVar7 = pIVar4->ActiveIdSource;
      goto LAB_002953ca;
    }
    fVar11 = (pIVar4->IO).NavInputs[(ulong)(uVar9 >> 0x14) + 0x1c];
    bVar5 = (pIVar4->IO).KeyShift;
    bVar1 = (pIVar4->IO).KeyAlt;
    fVar11 = (float)((uint)(bVar1 & 1) * (int)(fVar11 * 0.01) +
                    (uint)!(bool)(bVar1 & 1) * (int)fVar11);
    fVar11 = (float)((uint)(bVar5 & 1) * (int)(fVar11 * 10.0) +
                    (uint)!(bool)(bVar5 & 1) * (int)fVar11);
  }
  else {
LAB_002953ca:
    fVar11 = 0.0;
    if (IVar7 == ImGuiInputSource_Nav) {
      iVar8 = 0;
      if (uVar6 == 8) {
        iVar8 = ImParseFormatPrecision(format,3);
      }
      auVar16._0_8_ = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar16._8_56_ = extraout_var_02;
      local_38 = vmovlps_avx(auVar16._0_16_);
      fVar11 = *(float *)((long)&local_38 + (ulong)(uVar9 >> 0x14) * 4);
      auVar17._0_4_ = GetMinimumStepAtDecimalPrecision(iVar8);
      auVar17._4_60_ = extraout_var;
      uVar3 = vcmpss_avx512f(auVar17._0_16_,local_58,2);
      bVar5 = (bool)((byte)uVar3 & 1);
      v_speed = (float)((uint)bVar5 * (int)v_speed + (uint)!bVar5 * (int)auVar17._0_4_);
    }
  }
  auVar12._8_4_ = 0x80000000;
  auVar12._0_8_ = 0x8000000080000000;
  auVar12._12_4_ = 0x80000000;
  auVar12 = vxorps_avx512vl(ZEXT416((uint)(fVar11 * v_speed)),auVar12);
  auVar13._4_12_ = auVar12._4_12_;
  fVar11 = (float)((uint)(uVar9 == 0) * (int)(fVar11 * v_speed) + (uint)(uVar9 != 0) * auVar12._0_4_
                  );
  if ((flags & 0x20U) != 0) {
    fVar21 = v_max - v_min;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar21),ZEXT416(0x358637bd),0xe);
    bVar5 = (bool)((byte)uVar3 & 1);
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar21),ZEXT416(0x7f7fffff),1);
    bVar1 = (bool)((byte)uVar3 & 1);
    fVar11 = (float)((uint)bVar1 *
                     ((uint)bVar5 * (int)(fVar11 / fVar21) + (uint)!bVar5 * (int)fVar11) +
                    (uint)!bVar1 * (int)fVar11);
  }
  auVar13._0_4_ = fVar11;
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar11)) goto LAB_00295521;
    uVar10 = vcmpps_avx512vl(ZEXT416((uint)*v),auVar20._0_16_,2);
    uVar2 = vcmpps_avx512vl(auVar13,ZEXT816(0),1);
    uVar10 = uVar10 & uVar2;
  }
  else {
    uVar10 = 0;
  }
  if ((pIVar4->ActiveIdIsJustActivated == false) && ((uVar10 & 1) == 0)) {
    if ((fVar11 != 0.0) || (NAN(fVar11))) {
      pIVar4->DragCurrentAccum = fVar11 + pIVar4->DragCurrentAccum;
      pIVar4->DragCurrentAccumDirty = true;
    }
    else if ((pIVar4->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    fVar21 = *v;
    if ((flags & 0x20U) == 0) {
      auVar12 = ZEXT416((uint)(fVar21 + pIVar4->DragCurrentAccum));
      local_68 = 0.0;
      local_80 = 0.0;
    }
    else {
      if (uVar6 == 8) {
        iVar8 = ImParseFormatPrecision(format,3);
        fVar14 = (float)iVar8;
      }
      else {
        fVar14 = 1.0;
      }
      local_80 = powf(0.1,fVar14);
      local_68 = ScaleRatioFromValueT<float,float,float>
                           (data_type,fVar21,v_min,v_max,true,local_80,0.0);
      auVar18._0_4_ =
           ScaleValueFromRatioT<float,float,float>
                     (data_type,local_68 + pIVar4->DragCurrentAccum,v_min,v_max,true,local_80,0.0);
      auVar18._4_60_ = extraout_var_00;
      auVar12 = auVar18._0_16_;
    }
    if ((flags & 0x40U) == 0) {
      auVar19._0_4_ = RoundScalarWithFormatT<float,float>(format,data_type,auVar12._0_4_);
      auVar19._4_60_ = extraout_var_01;
      auVar12 = auVar19._0_16_;
    }
    pIVar4->DragCurrentAccumDirty = false;
    fVar21 = auVar12._0_4_;
    if ((flags & 0x20U) == 0) {
      fVar14 = fVar21 - *v;
    }
    else {
      fVar14 = ScaleRatioFromValueT<float,float,float>
                         (data_type,fVar21,v_min,v_max,true,local_80,0.0);
      fVar14 = fVar14 - local_68;
    }
    pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum - fVar14;
    auVar15._0_12_ = ZEXT812(0);
    auVar15._12_4_ = 0;
    uVar3 = vcmpss_avx512f(auVar12,auVar15,0);
    fVar21 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar21);
    fVar14 = *v;
    if (v_min < v_max) {
      if ((fVar14 != fVar21) || (NAN(fVar14) || NAN(fVar21))) {
        if ((fVar21 < v_min) || (((uVar6 != 8 && (fVar14 < fVar21)) && (fVar11 < 0.0)))) {
          fVar21 = v_min;
        }
        if ((v_max < fVar21) || (((uVar6 != 8 && (fVar21 < fVar14)) && (0.0 < fVar11)))) {
          fVar21 = v_max;
        }
      }
    }
    if ((fVar14 == fVar21) && (!NAN(fVar14) && !NAN(fVar21))) {
      return false;
    }
    *v = fVar21;
    return true;
  }
LAB_00295521:
  pIVar4->DragCurrentAccum = 0.0;
  pIVar4->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}